

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint64_t farmhashxo::Hash64(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar8 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar8 >> 0x2f ^ uVar8) * -0x651e95c4d06fbfb1;
        }
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar8 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
        uVar8 = (uVar8 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar8) * lVar6;
        uVar8 = uVar8 >> 0x2f ^ uVar8;
      }
      else {
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar8 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar8) * lVar6;
        uVar8 = ((uVar8 >> 0x25 | uVar8 << 0x1b) * lVar6 + uVar1 ^ uVar2) * lVar6;
        uVar8 = (uVar8 >> 0x2f ^ uVar2 ^ uVar8) * lVar6;
        uVar8 = uVar8 >> 0x2f ^ uVar8;
      }
    }
    else {
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      uVar2 = *(long *)(s + (len - 8)) * lVar6;
      uVar8 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
      uVar8 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
      uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar6;
      uVar8 = uVar8 >> 0x2f ^ uVar8;
    }
  }
  else {
    if (0x40 < len) {
      if (len < 0x61) {
        lVar6 = len * 2 + -0x651e95c4d06fc023;
        uVar1 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
        uVar8 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
        uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
        uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar1;
        uVar8 = ((uVar1 >> 0x1e | uVar1 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                 *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar2) * -0x651e95c4d06fc023;
        uVar2 = (uVar8 >> 0x2f ^ uVar2 ^ uVar8) * -0x651e95c4d06fc023;
        uVar13 = *(long *)(s + 0x38) * lVar6;
        uVar8 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
        uVar1 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
        uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d + uVar13
        ;
        uVar8 = ((uVar13 >> 0x1e | uVar13 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                 *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
        uVar1 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar6;
        uVar14 = *(long *)(s + (len - 8)) * lVar6;
        uVar8 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
        uVar13 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
        uVar13 = (uVar13 >> 0x12 | uVar13 << 0x2e) +
                 *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + uVar14 +
                 (uVar1 >> 0x2f ^ uVar1);
        uVar8 = ((uVar14 >> 0x1e | uVar14 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                 *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar2 >> 0x2f ^ uVar2) ^
                uVar13) * lVar6;
        uVar8 = (uVar8 >> 0x2f ^ uVar13 ^ uVar8) * lVar6;
        return ((uVar1 >> 0x15) + (uVar2 >> 0x11) + (uVar8 >> 0x2f ^ uVar8) * 9) * lVar6;
      }
      if (len < 0x101) {
        if (0x20 < len) {
          if (len < 0x41) {
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
            uVar1 = *(long *)(s + (len - 8)) * lVar6;
            uVar8 = lVar3 + *(long *)(s + 8);
            uVar8 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                    *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
            uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
            uVar1 = (uVar2 >> 0x12 | uVar2 << 0x2e) + lVar3 + uVar1;
            uVar2 = (uVar8 ^ uVar1) * lVar6;
            uVar13 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar6;
            uVar2 = (uVar8 + *(long *)(s + (len - 0x20))) * lVar6;
            uVar8 = *(long *)(s + 0x10) * lVar6 + *(long *)(s + 0x18);
            uVar1 = lVar3 + *(long *)(s + 0x18);
            uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x10) * lVar6 + uVar2;
            uVar8 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                     ((uVar13 >> 0x2f ^ uVar13) * lVar6 + *(long *)(s + (len - 0x18))) * lVar6 ^
                    uVar1) * lVar6;
            uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar6;
            uVar4 = (uVar8 >> 0x2f ^ uVar8) * lVar6;
          }
          else {
            lVar9 = *(long *)s + 0x1529cba0ca458ff;
            uVar8 = len - 1 & 0xffffffffffffffc0;
            uVar13 = (ulong)((uint)(len - 1) & 0x3f);
            lVar11 = 0x226bb95b4e64b6d4;
            uVar2 = 0x134a747f856d0526;
            uVar14 = 0;
            lVar3 = 0;
            uVar1 = 0;
            lVar15 = 0;
            lVar6 = 0;
            do {
              uVar10 = lVar9 + lVar15 + lVar11 + *(long *)(s + uVar14 + 8);
              uVar12 = lVar11 + lVar6 + *(long *)(s + uVar14 + 0x30);
              lVar11 = lVar15 + *(long *)(s + uVar14 + 0x28) +
                       (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d;
              uVar12 = uVar2 + lVar3;
              lVar6 = lVar6 * -0x4b6d499041670d8d + *(long *)(s + uVar14);
              uVar7 = *(long *)(s + uVar14 + 8) + lVar6 + *(long *)(s + uVar14 + 0x10);
              lVar15 = uVar7 + *(long *)(s + uVar14 + 0x18);
              uVar2 = (uVar10 >> 0x25 | uVar10 * 0x8000000) * -0x4b6d499041670d8d ^ uVar1;
              lVar9 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * -0x4b6d499041670d8d;
              uVar12 = lVar3 + lVar6 + *(long *)(s + uVar14 + 0x18) + uVar2;
              lVar6 = lVar6 + (uVar7 >> 0x2c | uVar7 * 0x100000) + (uVar12 >> 0x15 | uVar12 << 0x2b)
              ;
              lVar5 = uVar1 + lVar9 + *(long *)(s + uVar14 + 0x20);
              uVar1 = *(long *)(s + uVar14 + 0x10) + lVar5 + lVar11 + *(long *)(s + uVar14 + 0x38);
              uVar12 = *(long *)(s + uVar14 + 0x28) + *(long *)(s + uVar14 + 0x30) + lVar5;
              lVar3 = uVar12 + *(long *)(s + uVar14 + 0x38);
              uVar1 = lVar5 + (uVar12 >> 0x2c | uVar12 * 0x100000) + (uVar1 >> 0x15 | uVar1 << 0x2b)
              ;
              uVar14 = uVar14 + 0x40;
            } while (uVar8 != uVar14);
            lVar5 = (uVar2 & 0xff) * 2 + -0x4b6d499041670d8d;
            lVar15 = lVar15 + lVar3 + uVar13;
            lVar3 = lVar3 + uVar13 + lVar15;
            uVar14 = lVar9 + lVar11 + *(long *)(s + uVar13 + (uVar8 - 0x37)) + lVar15;
            uVar7 = lVar11 + lVar6 + *(long *)(s + uVar13 + (uVar8 - 0xf));
            uVar12 = uVar1 * 9 ^ (uVar14 >> 0x25 | uVar14 * 0x8000000) * lVar5;
            uVar7 = lVar15 * 9 + *(long *)(s + uVar13 + (uVar8 - 0x17)) +
                    (uVar7 >> 0x2a | uVar7 * 0x400000) * lVar5;
            uVar2 = uVar2 + lVar3;
            lVar6 = lVar6 * lVar5 + *(long *)(s + uVar13 + (uVar8 - 0x3f));
            uVar14 = lVar3 + lVar6 + uVar12 + *(long *)(s + uVar13 + (uVar8 - 0x27));
            uVar10 = *(long *)(s + uVar13 + (uVar8 - 0x37)) + *(long *)(s + uVar13 + (uVar8 - 0x2f))
                     + lVar6;
            uVar2 = uVar2 >> 0x21 | uVar2 * 0x80000000;
            lVar3 = uVar2 * lVar5 + uVar1 + *(long *)(s + uVar13 + (uVar8 - 0x1f));
            uVar16 = *(long *)(s + uVar13 + (uVar8 - 0x17)) + *(long *)(s + uVar13 + (uVar8 - 0xf))
                     + lVar3;
            uVar17 = uVar16 + *(long *)(s + uVar13 + (uVar8 - 7));
            uVar1 = *(long *)(s + uVar13 + (uVar8 - 0x2f)) + uVar7 +
                    *(long *)(s + uVar13 + (uVar8 - 7)) + lVar3;
            uVar1 = (uVar16 >> 0x2c | uVar16 * 0x100000) + lVar3 + (uVar1 >> 0x15 | uVar1 << 0x2b);
            uVar8 = (uVar10 + *(long *)(s + uVar13 + (uVar8 - 0x27)) ^ uVar17) * lVar5;
            uVar8 = (uVar8 >> 0x2f ^ uVar17 ^ uVar8) * lVar5;
            uVar8 = ((uVar10 >> 0x2c | uVar10 * 0x100000) + lVar6 +
                     (uVar14 >> 0x15 | uVar14 << 0x2b) ^ uVar1) * lVar5;
            uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar5;
            uVar8 = ((uVar8 >> 0x2f ^ uVar8) + uVar2) * lVar5;
            uVar8 = ((uVar7 >> 0x2f ^ uVar7) * -0x3c5a37a36834ced9 + uVar12 +
                     (uVar8 >> 0x2f ^ uVar8) * lVar5 ^ uVar8) * lVar5;
            uVar8 = (uVar8 >> 0x2f ^ uVar8 ^ uVar8) * lVar5;
            uVar4 = (uVar8 >> 0x2f ^ uVar8) * lVar5;
          }
          return uVar4;
        }
        if (len < 0x11) {
          if (len < 8) {
            if (len < 4) {
              if (len == 0) {
                return 0x9ae16a3b2f90404f;
              }
              uVar8 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                      (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
              return (uVar8 >> 0x2f ^ uVar8) * -0x651e95c4d06fbfb1;
            }
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            uVar8 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
            uVar8 = (uVar8 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar8) * lVar6;
            uVar8 = uVar8 >> 0x2f ^ uVar8;
          }
          else {
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
            uVar8 = *(ulong *)(s + (len - 8));
            uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar8) * lVar6;
            uVar8 = ((uVar8 >> 0x25 | uVar8 << 0x1b) * lVar6 + uVar1 ^ uVar2) * lVar6;
            uVar8 = (uVar8 >> 0x2f ^ uVar2 ^ uVar8) * lVar6;
            uVar8 = uVar8 >> 0x2f ^ uVar8;
          }
        }
        else {
          lVar6 = len * 2 + -0x651e95c4d06fbfb1;
          uVar2 = *(long *)(s + (len - 8)) * lVar6;
          uVar8 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
          uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
          uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
          uVar8 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
                   *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
          uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar6;
          uVar8 = uVar8 >> 0x2f ^ uVar8;
        }
        return uVar8 * lVar6;
      }
      uVar4 = farmhashuo::Hash64(s,len);
      return uVar4;
    }
    lVar6 = len * 2 + -0x651e95c4d06fbfcf;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)s;
    auVar22 = vpunpcklqdq_avx(auVar22,auVar24);
    auVar23._8_8_ = 0xb492b66fbe98f273;
    auVar23._0_8_ = 0xb492b66fbe98f273;
    auVar18 = vpmullq_avx512vl(auVar22,auVar23);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(s + (len - 8));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(s + 0x18);
    auVar22 = vpunpcklqdq_avx(auVar19,auVar20);
    auVar21._8_8_ = 0x9ae16a3b2f904031;
    auVar21._0_8_ = 0x9ae16a3b2f904031;
    auVar24 = vpinsrq_avx(auVar21,lVar6,0);
    auVar19 = vpmullq_avx512vl(auVar22,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(s + 0x10);
    auVar22 = vpunpcklqdq_avx(auVar25,auVar26);
    auVar27._8_8_ = 0x9ae16a3b2f90404f;
    auVar27._0_8_ = 0x9ae16a3b2f90404f;
    auVar20 = vpmullq_avx512vl(auVar22,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(s + 8);
    auVar23 = vpunpcklqdq_avx(auVar28,auVar29);
    auVar22 = vpaddq_avx(auVar18,auVar23);
    auVar21 = vprolq_avx512vl(auVar22,0x15);
    auVar22 = vprolq_avx512vl(auVar19,0x22);
    auVar22 = vpaddq_avx(auVar22,auVar20);
    auVar22 = vpaddq_avx(auVar22,auVar21);
    auVar23 = vpaddq_avx(auVar23,auVar27);
    auVar23 = vprolq_avx512vl(auVar23,0x2e);
    auVar23 = vpaddq_avx(auVar23,auVar19);
    auVar23 = vpaddq_avx(auVar23,auVar18);
    auVar22 = vpmullq_avx512vl(auVar22 ^ auVar23,auVar24);
    auVar18 = vpsrlq_avx(auVar22,0x2f);
    auVar22 = vpternlogq_avx512vl(auVar18,auVar23,auVar22,0x96);
    auVar22 = vpmullq_avx512vl(auVar22,auVar24);
    auVar23 = vpsrlq_avx(auVar22,0x2f);
    lVar3 = vpextrq_avx(auVar23 ^ auVar22,1);
    uVar8 = lVar3 + SUB168(auVar23 ^ auVar22,0) * lVar6;
  }
  return uVar8 * lVar6;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhashna::HashLen0to16(s, len);
    } else {
      return farmhashna::HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  } else if (len <= 96) {
    return HashLen65to96(s, len);
  } else if (len <= 256) {
    return farmhashna::Hash64(s, len);
  } else {
    return farmhashuo::Hash64(s, len);
  }
}